

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool __thiscall flatbuffers::FlatBufService::is_internal(FlatBufService *this)

{
  ServiceDef *pSVar1;
  Value *pVVar2;
  allocator<char> local_31;
  string local_30;
  
  pSVar1 = this->service_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"private",&local_31);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(pSVar1->super_Definition).attributes,&local_30)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  return pVVar2 != (Value *)0x0;
}

Assistant:

bool is_internal() const {
    return service_->Definition::attributes.Lookup("private") ? true : false;
  }